

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_NtkBalanceMulti(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize
                        )

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  int iVar2;
  int *pArray;
  uint *pCosts;
  int local_8a4;
  int local_8a0;
  int OccurBest2;
  int OccurBest;
  int OccurNew;
  int CostBest2;
  int CostBest;
  int CostNew;
  int iBest2;
  int iBest;
  int iStop;
  int i;
  int MatrixSize;
  int iLit;
  int k;
  int *pCost;
  int *pSuper;
  Vec_Int_t *vCosts;
  Vec_Int_t *vSuper;
  ulong uStack_848;
  int Limit;
  word pMatrix [256];
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  Str_Obj_t *pObj_local;
  Str_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  p_00 = pNew->vSuper;
  p_01 = pNew->vStore;
  pMatrix[0xff]._4_4_ = nLutSize;
  pArray = Vec_IntArray(p_00);
  pCosts = (uint *)Vec_IntArray(p_01);
  iVar1 = Vec_IntCap(p_00);
  if (iVar1 < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vSuper)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x449,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  iVar1 = Vec_IntCap(p_01);
  if (0xff < iVar1) {
    Vec_IntClear(p_00);
    for (MatrixSize = 0; MatrixSize < (int)(*(uint *)pObj >> 4); MatrixSize = MatrixSize + 1) {
      iVar1 = Str_ObjFaninCopy(p,pObj,MatrixSize);
      Vec_IntPush(p_00,iVar1);
    }
    Vec_IntSort(p_00,0);
    if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
      Gia_ManSimplifyAnd(p_00);
    }
    else {
      Gia_ManSimplifyXor(p_00);
    }
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 < 1) {
      __assert_fail("Vec_IntSize(vSuper) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x455,
                    "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 == 1) {
      iVar1 = Vec_IntEntry(p_00,0);
      pObj->iCopy = iVar1;
    }
    else {
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 == 2) {
        iVar1 = Str_NtkBalanceTwo(pNew,p,pObj,0,1,vDelay,(int *)pCosts,pArray,
                                  &stack0xfffffffffffff7b8,2,pMatrix[0xff]._4_4_,-1);
        pObj->iCopy = iVar1;
      }
      else {
        Vec_IntClear(p_01);
        for (MatrixSize = 0; iVar1 = Vec_IntSize(p_00), MatrixSize < iVar1;
            MatrixSize = MatrixSize + 1) {
          iVar1 = Vec_IntEntry(p_00,MatrixSize);
          iVar1 = Abc_Lit2Var(iVar1);
          iVar1 = Vec_IntEntry(vDelay,iVar1);
          Vec_IntPush(p_01,iVar1);
        }
        iVar1 = Vec_IntSize(p_00);
        Vec_IntSelectSortCost2(pArray,iVar1,(int *)pCosts);
        iVar1 = Vec_IntSize(p_00);
        if (iVar1 < 0x40) {
          Str_ManVectorAffinity(pNew,p_00,p_01,&stack0xfffffffffffff7b8,0x100);
        }
        while (iVar1 = Vec_IntSize(p_00), 2 < iVar1) {
          iVar1 = Vec_IntSize(p_00);
          if (iVar1 < 0x41) {
            iVar1 = Vec_IntSize(p_00);
            if (iVar1 == 0x40) {
              Str_ManVectorAffinity(pNew,p_00,p_01,&stack0xfffffffffffff7b8,0x100);
            }
            iVar1 = Vec_IntSize(p_00);
            if (0x40 < iVar1) {
              __assert_fail("Vec_IntSize(vSuper) <= 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                            ,0x47e,
                            "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            if ((*pCosts == 0x11) && (pCosts[1] == 0x11)) {
              iVar1 = Vec_IntSize(p_00);
              Str_NtkBalanceTwo(pNew,p,pObj,0,1,vDelay,(int *)pCosts,pArray,&stack0xfffffffffffff7b8
                                ,iVar1,pMatrix[0xff]._4_4_,2);
              p_00->nSize = p_00->nSize + -1;
              p_01->nSize = p_01->nSize + -1;
            }
            else {
              iBest2 = 0;
              while ((iVar1 = Vec_IntSize(p_00), iBest2 < iVar1 &&
                     ((int)pCosts[iBest2] >> 4 == (int)*pCosts >> 4))) {
                iBest2 = iBest2 + 1;
              }
              if (iBest2 == 1) {
                CostNew = iBest2;
                local_8a0 = Str_CountBits(uStack_848 & pMatrix[0]);
                iBest = 1;
                while( true ) {
                  iBest = iBest + 1;
                  iVar1 = Vec_IntSize(p_00);
                  if ((iVar1 <= iBest) || ((int)pCosts[iBest] >> 4 != (int)pCosts[1] >> 4)) break;
                  iVar1 = Str_CountBits(uStack_848 & pMatrix[(long)iBest + -1]);
                  if (local_8a0 < iVar1) {
                    CostNew = iBest;
                    local_8a0 = iVar1;
                  }
                }
                if ((CostNew < 1) || (iVar1 = Vec_IntSize(p_00), iVar1 <= CostNew)) {
                  __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                                ,0x49a,
                                "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                               );
                }
                iVar1 = Vec_IntSize(p_00);
                Str_NtkBalanceTwo(pNew,p,pObj,0,CostNew,vDelay,(int *)pCosts,pArray,
                                  &stack0xfffffffffffff7b8,iVar1,pMatrix[0xff]._4_4_,-1);
                p_00->nSize = p_00->nSize + -1;
                p_01->nSize = p_01->nSize + -1;
              }
              else {
                CostNew = -1;
                OccurNew = -1;
                local_8a0 = -1;
                for (iBest = 1; iBest < iBest2; iBest = iBest + 1) {
                  iVar1 = (*pCosts & 0xf) + (pCosts[iBest] & 0xf);
                  if ((iVar1 <= pMatrix[0xff]._4_4_) &&
                     ((iVar2 = Str_CountBits(uStack_848 & pMatrix[(long)iBest + -1]),
                      OccurNew < iVar1 || ((OccurNew == iVar1 && (local_8a0 < iVar2)))))) {
                    CostNew = iBest;
                    local_8a0 = iVar2;
                    OccurNew = iVar1;
                  }
                }
                if (OccurNew == pMatrix[0xff]._4_4_) {
                  if ((CostNew < 1) || (iVar1 = Vec_IntSize(p_00), iVar1 <= CostNew)) {
                    __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                                  ,0x4ae,
                                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                                 );
                  }
                  iVar1 = Vec_IntSize(p_00);
                  Str_NtkBalanceTwo(pNew,p,pObj,0,CostNew,vDelay,(int *)pCosts,pArray,
                                    &stack0xfffffffffffff7b8,iVar1,pMatrix[0xff]._4_4_,OccurNew);
                  p_00->nSize = p_00->nSize + -1;
                  p_01->nSize = p_01->nSize + -1;
                }
                else {
                  CostBest = -1;
                  CostNew = -1;
                  OccurBest = -1;
                  OccurNew = -1;
                  local_8a4 = -1;
                  local_8a0 = -1;
                  for (iBest = 0; MatrixSize = iBest, iBest < iBest2; iBest = iBest + 1) {
                    while (MatrixSize = MatrixSize + 1, MatrixSize < iBest2) {
                      iVar1 = (pCosts[iBest] & 0xf) + (pCosts[MatrixSize] & 0xf);
                      iVar2 = Str_CountBits(pMatrix[(long)iBest + -1] &
                                            pMatrix[(long)MatrixSize + -1]);
                      if (pMatrix[0xff]._4_4_ < iVar1) {
                        if ((local_8a4 < iVar2) || ((local_8a4 == iVar2 && (OccurBest < iVar1)))) {
                          CostBest = iBest << 0x10 | MatrixSize;
                          local_8a4 = iVar2;
                          OccurBest = iVar1;
                        }
                      }
                      else if ((local_8a0 < iVar2) || ((local_8a0 == iVar2 && (OccurNew < iVar1))))
                      {
                        CostNew = iBest << 0x10 | MatrixSize;
                        local_8a0 = iVar2;
                        OccurNew = iVar1;
                      }
                    }
                  }
                  if (CostNew < 0) {
                    if (CostBest < 1) {
                      __assert_fail("iBest2 > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                                    ,0x4cf,
                                    "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                                   );
                    }
                    iVar1 = Vec_IntSize(p_00);
                    Str_NtkBalanceTwo(pNew,p,pObj,CostBest >> 0x10,CostBest & 0xffff,vDelay,
                                      (int *)pCosts,pArray,&stack0xfffffffffffff7b8,iVar1,
                                      pMatrix[0xff]._4_4_,-1);
                    p_00->nSize = p_00->nSize + -1;
                    p_01->nSize = p_01->nSize + -1;
                  }
                  else {
                    if (CostNew < 1) {
                      __assert_fail("iBest > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                                    ,0x4c8,
                                    "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                                   );
                    }
                    iVar1 = Vec_IntSize(p_00);
                    Str_NtkBalanceTwo(pNew,p,pObj,CostNew >> 0x10,CostNew & 0xffff,vDelay,
                                      (int *)pCosts,pArray,&stack0xfffffffffffff7b8,iVar1,
                                      pMatrix[0xff]._4_4_,OccurNew);
                    p_00->nSize = p_00->nSize + -1;
                    p_01->nSize = p_01->nSize + -1;
                  }
                }
              }
            }
          }
          else {
            iVar1 = Vec_IntSize(p_00);
            Str_NtkBalanceTwo(pNew,p,pObj,0,1,vDelay,(int *)pCosts,pArray,&stack0xfffffffffffff7b8,
                              iVar1,pMatrix[0xff]._4_4_,-1);
            p_00->nSize = p_00->nSize + -1;
            p_01->nSize = p_01->nSize + -1;
          }
        }
        iVar1 = Str_NtkBalanceTwo(pNew,p,pObj,0,1,vDelay,(int *)pCosts,pArray,
                                  &stack0xfffffffffffff7b8,2,pMatrix[0xff]._4_4_,-1);
        pObj->iCopy = iVar1;
      }
    }
    return;
  }
  __assert_fail("Limit <= Vec_IntCap(vCosts)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                ,0x44a,
                "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)")
  ;
}

Assistant:

void Str_NtkBalanceMulti( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    word pMatrix[256];
    int Limit = 256;
    Vec_Int_t * vSuper = pNew->vSuper;
    Vec_Int_t * vCosts = pNew->vStore;
    int * pSuper = Vec_IntArray(vSuper);
    int * pCost  = Vec_IntArray(vCosts);
    int k, iLit, MatrixSize = 0;
    assert( Limit <= Vec_IntCap(vSuper) );
    assert( Limit <= Vec_IntCap(vCosts) );

    // collect nodes
    Vec_IntClear( vSuper );
    for ( k = 0; k < (int)pObj->nFanins; k++ )
        Vec_IntPush( vSuper, Str_ObjFaninCopy(p, pObj, k) );
    Vec_IntSort( vSuper, 0 );
    if ( pObj->Type == STR_AND )
        Gia_ManSimplifyAnd( vSuper );
    else
        Gia_ManSimplifyXor( vSuper );
    assert( Vec_IntSize(vSuper) > 0 );
    if ( Vec_IntSize(vSuper) == 1 )
    {
        pObj->iCopy = Vec_IntEntry(vSuper, 0);
        return;
    }
    if ( Vec_IntSize(vSuper) == 2 )
    {
        pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );
        return;
    }

    // sort by cost
    Vec_IntClear( vCosts );
    Vec_IntForEachEntry( vSuper, iLit, k )
        Vec_IntPush( vCosts, Vec_IntEntry(vDelay, Abc_Lit2Var(iLit)) );
    Vec_IntSelectSortCost2( pSuper, Vec_IntSize(vSuper), pCost );

    // compute affinity
    if ( Vec_IntSize(vSuper) < 64 )
        MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );

    // start the new product
    while ( Vec_IntSize(vSuper) > 2 )
    {
        // pair the first entry with another one on the same level
        int i, iStop, iBest,iBest2;
        int CostNew, CostBest, CostBest2;
        int OccurNew, OccurBest, OccurBest2;

        if ( Vec_IntSize(vSuper) > 64 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // compute affinity
        if ( Vec_IntSize(vSuper) == 64 )
            MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );
        assert( Vec_IntSize(vSuper) <= 64 );
//        Str_PrintState( pCost, pSuper, pMatrix, Vec_IntSize(vSuper) );

        // if the first two are PIs group them
        if ( pCost[0] == 17 && pCost[1] == 17 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, 2 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // find the end of the level
        for ( iStop = 0; iStop < Vec_IntSize(vSuper); iStop++ )
            if ( (pCost[iStop] >> 4) != (pCost[0] >> 4) )
                break;
        // if there is only one this level, pair it with the best match in the next level
        if ( iStop == 1 )
        {
            iBest = iStop, OccurBest = Str_CountBits(pMatrix[0] & pMatrix[iStop]);
            for ( i = iStop + 1; i < Vec_IntSize(vSuper); i++ )
            {
                if ( (pCost[i] >> 4) != (pCost[iStop] >> 4) )
                    break;
                OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
                if ( OccurBest < OccurNew )
                    iBest = i, OccurBest = OccurNew;
            }
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // pair the first entry with another one on the same level
        iBest = -1; CostBest = -1; OccurBest2 = -1; OccurBest = -1;
        for ( i = 1; i < iStop; i++ )
        {
            CostNew = (pCost[0] & 15) + (pCost[i] & 15);
            if ( CostNew > nLutSize )
                continue;
            OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
            if ( CostBest < CostNew || (CostBest == CostNew && OccurBest < OccurNew) )
                CostBest = CostNew, iBest = i, OccurBest = OccurNew;
        }
        // if the best found is perfect, take it
        if ( CostBest == nLutSize )
        {
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // find the best pair on this level
        iBest = iBest2 = -1; CostBest = CostBest2 = -1, OccurBest = OccurBest2 = -1;
        for ( i = 0; i < iStop; i++ )
        for ( k = i+1; k < iStop; k++ )
        {
            CostNew  = (pCost[i] & 15) + (pCost[k] & 15);
            OccurNew = Str_CountBits(pMatrix[i] & pMatrix[k]);
            if ( CostNew <= nLutSize ) // the same level
            {
                if ( OccurBest < OccurNew || (OccurBest == OccurNew && CostBest < CostNew ))
                    CostBest = CostNew, iBest = (i << 16) | k, OccurBest = OccurNew;
            }
            else // overflow to the next level
            {
                if ( OccurBest2 < OccurNew || (OccurBest2 == OccurNew && CostBest2 < CostNew) )
                    CostBest2 = CostNew, iBest2 = (i << 16) | k, OccurBest2 = OccurNew;
            }
        }
        if ( iBest >= 0 )
        {
            assert( iBest > 0 );
            Str_NtkBalanceTwo( pNew, p, pObj, iBest>>16, iBest&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // take any remaining pair
        assert( iBest2 > 0 );
        Str_NtkBalanceTwo( pNew, p, pObj, iBest2>>16, iBest2&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
        vSuper->nSize--;
        vCosts->nSize--;
        continue;
    }
    pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );

/*
    // simple
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < Vec_IntSize(vSuper); k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
*/
}